

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

bool __thiscall license::EventRegistry::turnWarningsIntoErrors(EventRegistry *this)

{
  pointer_conflict paVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  pointer_conflict paVar4;
  
  paVar4 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    for (p_Var2 = (this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var2 !=
        &(this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (paVar4[*(long *)(p_Var2 + 2)].severity - SVRT_WARN < 2) {
        paVar4[*(long *)(p_Var2 + 2)].severity = SVRT_ERROR;
        bVar3 = true;
      }
    }
    if (bVar3) {
      return true;
    }
  }
  paVar1 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (; paVar4 != paVar1; paVar4 = paVar4 + 1) {
    if (paVar4->severity == SVRT_WARN) {
      paVar4->severity = SVRT_ERROR;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool EventRegistry::turnWarningsIntoErrors() {
	bool eventFound = false;
	if (mostAdvancedLogIdx_by_LicenseId.size() > 0) {
		for (const auto &mostAdvLogIter : mostAdvancedLogIdx_by_LicenseId) {
			AuditEvent &currentLog = logs[mostAdvLogIter.second];
			if (currentLog.severity == SVRT_WARN || currentLog.severity == SVRT_ERROR) {
				currentLog.severity = SVRT_ERROR;
				eventFound = true;
			}
		}
	}
	if (!eventFound) {
		for (auto it = logs.begin(); it != logs.end(); ++it) {
			if (it->severity == SVRT_WARN) {
				it->severity = SVRT_ERROR;
				eventFound = true;
			}
		}
	}
	return eventFound;
}